

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

AssertionResult __thiscall testing::AssertionResult::operator!(AssertionResult *this)

{
  String *pSVar1;
  String *extraout_RDX;
  String *extraout_RDX_00;
  scoped_ptr<testing::internal::String> sVar2;
  byte *in_RSI;
  AssertionResult AVar3;
  AssertionResult *this_local;
  AssertionResult *negation;
  
  AssertionResult(this,(bool)(~*in_RSI & 1));
  pSVar1 = internal::scoped_ptr<testing::internal::String>::get
                     ((scoped_ptr<testing::internal::String> *)(in_RSI + 8));
  sVar2.ptr_ = extraout_RDX;
  if (pSVar1 != (String *)0x0) {
    pSVar1 = internal::scoped_ptr<testing::internal::String>::operator*
                       ((scoped_ptr<testing::internal::String> *)(in_RSI + 8));
    operator<<(this,pSVar1);
    sVar2.ptr_ = extraout_RDX_00;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult AssertionResult::operator!() const {
  AssertionResult negation(!success_);
  if (message_.get() != NULL)
    negation << *message_;
  return negation;
}